

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteFieldStringBytesAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,Options *options,
               bool builder,bool kdoc)

{
  pointer pcVar1;
  char *pcVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  local_120[4] = options->opensource_runtime;
  local_120[5] = options->annotate_code;
  local_120[0] = options->generate_immutable_code;
  local_120[1] = options->generate_mutable_code;
  local_120[2] = options->generate_shared_code;
  local_120[3] = options->enforce_lite;
  local_118._M_p = (pointer)&local_108;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + (options->annotation_list_file)._M_string_length);
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + (options->output_list_file)._M_string_length);
  local_d8._0_1_ = options->strip_nonfunctional_codegen;
  local_d8._1_1_ = options->jvm_dsl;
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field,(Options *)local_120,kdoc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  local_80[4] = options->opensource_runtime;
  local_80[5] = options->annotate_code;
  local_80[0] = options->generate_immutable_code;
  local_80[1] = options->generate_mutable_code;
  local_80[2] = options->generate_shared_code;
  local_80[3] = options->enforce_lite;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (options->annotation_list_file)._M_string_length);
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (options->output_list_file)._M_string_length);
  local_38._0_1_ = options->strip_nonfunctional_codegen;
  local_38._1_1_ = options->jvm_dsl;
  WriteDebugString(printer,field,(Options *)local_80,kdoc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if (!kdoc) {
    local_d0[4] = options->opensource_runtime;
    local_d0[5] = options->annotate_code;
    local_d0[0] = options->generate_immutable_code;
    local_d0[1] = options->generate_mutable_code;
    local_d0[2] = options->generate_shared_code;
    local_d0[3] = options->enforce_lite;
    pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
    local_c8._M_p = (pointer)&local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + (options->annotation_list_file)._M_string_length)
    ;
    pcVar1 = (options->output_list_file)._M_dataplus._M_p;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + (options->output_list_file)._M_string_length);
    local_88._0_1_ = options->strip_nonfunctional_codegen;
    local_88._1_1_ = options->jvm_dsl;
    WriteDeprecatedJavadoc(printer,field,type,(Options *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
  }
  switch(type) {
  case GETTER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @return The bytes for $name$.\n";
    sVar3 = 0x21;
    break;
  case SETTER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @param value The bytes for $name$ to set.\n";
    sVar3 = 0x2d;
    break;
  default:
    goto switchD_0024e415_caseD_3;
  case LIST_GETTER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @return A list containing the bytes for $name$.\n";
    sVar3 = 0x33;
    break;
  case LIST_INDEXED_GETTER:
    text_00._M_str = " * @param index The index of the value to return.\n";
    text_00._M_len = 0x32;
    io::Printer::Print<>(printer,text_00);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @return The bytes of the $name$ at the given index.\n";
    sVar3 = 0x37;
    break;
  case LIST_INDEXED_SETTER:
    text_01._M_str = " * @param index The index to set the value at.\n";
    text_01._M_len = 0x2f;
    io::Printer::Print<>(printer,text_01);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @param value The bytes of the $name$ to set.\n";
    goto LAB_0024e53b;
  case LIST_ADDER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @param value The bytes of the $name$ to add.\n";
LAB_0024e53b:
    sVar3 = 0x30;
    break;
  case LIST_MULTI_ADDER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar2 = " * @param values The bytes of the $name$ to add.\n";
    sVar3 = 0x31;
  }
  text_02._M_str = pcVar2;
  text_02._M_len = sVar3;
  io::Printer::Print<char[5],std::__cxx11::string>(printer,text_02,(char (*) [5])0x472c7f,args_1);
switchD_0024e415_caseD_3:
  if (builder) {
    text_03._M_str = " * @return This builder for chaining.\n";
    text_03._M_len = 0x26;
    io::Printer::Print<>(printer,text_03);
  }
  text_04._M_str = " */\n";
  text_04._M_len = 4;
  io::Printer::Print<>(printer,text_04);
  return;
}

Assistant:

void WriteFieldStringBytesAccessorDocComment(io::Printer* printer,
                                             const FieldDescriptor* field,
                                             const FieldAccessorType type,
                                             const Options options,
                                             const bool builder,
                                             const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  if (!kdoc) WriteDeprecatedJavadoc(printer, field, type, options);
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(" * @return The bytes for $name$.\n", "name",
                     field->camelcase_name());
      break;
    case SETTER:
      printer->Print(" * @param value The bytes for $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(" * @return A list containing the bytes for $name$.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(" * @return The bytes of the $name$ at the given index.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(" * @param value The bytes of the $name$ to set.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(" * @param value The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(" * @param values The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}